

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProtocolIPv4.cpp
# Opt level: O2

void __thiscall ProtocolIPv4::ProcessRx(ProtocolIPv4 *this,DataBuffer *buffer)

{
  byte *addr;
  byte bVar1;
  byte bVar2;
  bool bVar3;
  uint16_t uVar4;
  byte *pbVar5;
  uint uVar6;
  
  pbVar5 = buffer->Packet;
  bVar1 = *pbVar5;
  uVar4 = Unpack16(pbVar5,2);
  bVar2 = pbVar5[9];
  addr = pbVar5 + 0x10;
  bVar3 = IsLocal(this,addr);
  if (bVar3) {
    uVar6 = (bVar1 & 0xf) << 2;
    buffer->Packet = buffer->Packet + uVar6;
    pbVar5 = pbVar5 + 0xc;
    buffer->Length = uVar4 - (short)uVar6;
    if (bVar2 == 0x11) {
      ProtocolUDP::ProcessRx(this->UDP,buffer,pbVar5,addr);
      return;
    }
    if (bVar2 != 2) {
      uVar6 = (uint)bVar2;
      if (uVar6 == 6) {
        ProtocolTCP::ProcessRx(this->TCP,buffer,pbVar5,addr);
        return;
      }
      if (uVar6 == 1) {
        ProtocolICMP::ProcessRx(this->ICMP,buffer,pbVar5,addr);
        return;
      }
      printf("Unsupported IP Protocol 0x%02X\n",(ulong)uVar6);
      return;
    }
  }
  return;
}

Assistant:

void ProtocolIPv4::ProcessRx(DataBuffer* buffer)
{
    uint8_t headerLength;
    uint8_t protocol;
    uint8_t* sourceIP;
    uint8_t* targetIP;
    uint8_t* packet = buffer->Packet;
    uint16_t length = buffer->Length;
    uint16_t dataLength;

    headerLength = (packet[0] & 0x0F) * 4;
    dataLength = Unpack16(packet, 2);
    protocol = packet[9];
    sourceIP = &packet[12];
    targetIP = &packet[16];

    if (IsLocal(targetIP))
    {
        buffer->Packet += headerLength;
        dataLength -= headerLength;
        buffer->Length = dataLength;

        switch (protocol)
        {
        case 0x01: // ICMP
            ICMP.ProcessRx(buffer, sourceIP, targetIP);
            break;
        case 0x02: // IGMP
            break;
        case 0x06: // TCP
            TCP.ProcessRx(buffer, sourceIP, targetIP);
            break;
        case 0x11: // UDP
            UDP.ProcessRx(buffer, sourceIP, targetIP);
            break;
        default: printf("Unsupported IP Protocol 0x%02X\n", protocol); break;
        }
    }
}